

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_relaxation.c
# Opt level: O2

int arkRelaxAccessMem(void *arkode_mem,char *fname,ARKodeMem *ark_mem,ARKodeRelaxMem *relax_mem)

{
  int line;
  int error_code;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "arkode_mem = NULL illegal.";
    error_code = -0x15;
    line = 0x2a;
    arkode_mem = (ARKodeMem)0x0;
  }
  else {
    *ark_mem = (ARKodeMem)arkode_mem;
    if (*(ARKodeRelaxMem *)((long)arkode_mem + 1000) != (ARKodeRelaxMem)0x0) {
      *relax_mem = *(ARKodeRelaxMem *)((long)arkode_mem + 1000);
      return 0;
    }
    msgfmt = "Relaxation memory is NULL.";
    error_code = -0x2c;
    line = 0x32;
  }
  arkProcessError((ARKodeMem)arkode_mem,error_code,line,fname,
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_relaxation.c"
                  ,msgfmt);
  return error_code;
}

Assistant:

static int arkRelaxAccessMem(void* arkode_mem, const char* fname,
                             ARKodeMem* ark_mem, ARKodeRelaxMem* relax_mem)
{
  if (!arkode_mem)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, fname, __FILE__,
                    MSG_ARK_NO_MEM);
    return ARK_MEM_NULL;
  }
  *ark_mem = (ARKodeMem)arkode_mem;

  if (!((*ark_mem)->relax_mem))
  {
    arkProcessError(*ark_mem, ARK_RELAX_MEM_NULL, __LINE__, fname, __FILE__,
                    MSG_RELAX_MEM_NULL);
    return ARK_RELAX_MEM_NULL;
  }
  *relax_mem = (ARKodeRelaxMem)((*ark_mem)->relax_mem);

  return ARK_SUCCESS;
}